

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_concat<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *left,
          ref<immutable::rrb<int,_false,_6>_> *right)

{
  uint32_t uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint32_t uVar5;
  rrb<int,_false,_6> *prVar6;
  leaf_node<int,_false> *plVar7;
  rrb<int,_false,_6> *prVar8;
  rrb<int,_false,_6> *prVar9;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_b0;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_a8;
  ref<immutable::rrb_details::tree_node<int,_false>_> find_shift_arg;
  ref<immutable::rrb_details::internal_node<int,_false>_> root_candidate;
  ref<immutable::rrb<int,_false,_6>_> local_90;
  ref<immutable::rrb<int,_false,_6>_> left2;
  ref<immutable::rrb<int,_false,_6>_> left_head;
  ref<immutable::rrb_details::leaf_node<int,_false>_> empty_leaf;
  ref<immutable::rrb<int,_false,_6>_> left_imitation;
  uint32_t i_2;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail_1;
  uint32_t new_tail_len_1;
  uint32_t i_1;
  uint32_t right_cut;
  uint32_t i;
  ref<immutable::rrb_details::leaf_node<int,_false>_> push_down;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  uint32_t new_tail_len;
  ref<immutable::rrb<int,_false,_6>_> local_28;
  ref<immutable::rrb<int,_false,_6>_> new_rrb_1;
  ref<immutable::rrb<int,_false,_6>_> *right_local;
  ref<immutable::rrb<int,_false,_6>_> *left_local;
  ref<immutable::rrb<int,_false,_6>_> *new_rrb;
  
  new_rrb_1.ptr = (rrb<int,_false,_6> *)right;
  prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
  if (prVar6->cnt == 0) {
    ref<immutable::rrb<int,_false,_6>_>::ref
              ((ref<immutable::rrb<int,_false,_6>_> *)this,
               (ref<immutable::rrb<int,_false,_6>_> *)new_rrb_1.ptr);
  }
  else {
    prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
    if (prVar6->cnt == 0) {
      ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)this,left);
    }
    else {
      prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
      if ((prVar6->root).ptr == (tree_node<int,_false> *)0x0) {
        prVar6 = rrb_details::rrb_head_clone<int,false,6>(left->ptr);
        ref<immutable::rrb<int,_false,_6>_>::ref(&local_28,prVar6);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
        uVar5 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
        prVar6->cnt = uVar5 + prVar6->cnt;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
        if (prVar6->tail_len == 0x40) {
          prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
          uVar5 = prVar6->tail_len;
          prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
          prVar6->tail_len = uVar5;
          prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
          rrb_details::push_down_tail<int,false,6>((rrb_details *)this,left,&local_28,&prVar6->tail)
          ;
        }
        else {
          prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
          uVar5 = prVar6->tail_len;
          prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
          if (uVar5 + prVar6->tail_len < 0x41) {
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
            uVar5 = prVar6->tail_len;
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
            uVar1 = prVar6->tail_len;
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
            plVar7 = (prVar6->tail).ptr;
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
            plVar7 = rrb_details::leaf_node_merge<int,false>(plVar7,(prVar6->tail).ptr);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&push_down,plVar7);
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar6->tail,&push_down)
            ;
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
            prVar6->tail_len = uVar5 + uVar1;
            ref<immutable::rrb<int,_false,_6>_>::ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)this,&local_28);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&push_down);
          }
          else {
            plVar7 = rrb_details::leaf_node_create<int,false>(0x40);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::ref
                      ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&right_cut,plVar7);
            for (i_1 = 0; prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left),
                i_1 < prVar6->tail_len; i_1 = i_1 + 1) {
              prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 (&prVar6->tail);
              iVar2 = plVar7->child[i_1];
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&right_cut)
              ;
              plVar7->child[i_1] = iVar2;
            }
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
            uVar4 = 0x40 - prVar6->tail_len;
            for (new_tail_1.ptr._4_4_ = 0; new_tail_1.ptr._4_4_ < uVar4;
                new_tail_1.ptr._4_4_ = new_tail_1.ptr._4_4_ + 1) {
              prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 (&prVar6->tail);
              iVar2 = plVar7->child[new_tail_1.ptr._4_4_];
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&right_cut)
              ;
              piVar3 = plVar7->child;
              prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
              piVar3[prVar6->tail_len + new_tail_1.ptr._4_4_] = iVar2;
            }
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
            new_tail_1.ptr._0_4_ = prVar6->tail_len - uVar4;
            plVar7 = rrb_details::leaf_node_create<int,false>((uint32_t)new_tail_1.ptr);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::ref
                      ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                       &stack0xffffffffffffff98,plVar7);
            for (left_imitation.ptr._4_4_ = 0; left_imitation.ptr._4_4_ < (uint32_t)new_tail_1.ptr;
                left_imitation.ptr._4_4_ = left_imitation.ptr._4_4_ + 1) {
              prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 (&prVar6->tail);
              iVar2 = plVar7->child[uVar4 + left_imitation.ptr._4_4_];
              plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                                  &stack0xffffffffffffff98);
              plVar7->child[left_imitation.ptr._4_4_] = iVar2;
            }
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                      (&prVar6->tail,
                       (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&right_cut);
            uVar5 = (uint32_t)new_tail_1.ptr;
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
            prVar6->tail_len = uVar5;
            prVar6 = rrb_details::rrb_head_clone<int,false,6>(left->ptr);
            ref<immutable::rrb<int,_false,_6>_>::ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf,prVar6);
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_28);
            uVar5 = prVar6->cnt - (uint32_t)new_tail_1.ptr;
            prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                               ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
            prVar6->cnt = uVar5;
            rrb_details::push_down_tail<int,false,6>
                      ((rrb_details *)this,(ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf,
                       &local_28,
                       (ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                       &stack0xffffffffffffff98);
            ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref
                      ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                       &stack0xffffffffffffff98);
            ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref
                      ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&right_cut);
          }
        }
        ref<immutable::rrb<int,_false,_6>_>::~ref(&local_28);
      }
      else {
        ref<immutable::rrb_details::leaf_node<int,_false>_>::ref
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head,
                   (leaf_node<int,_false> *)0x0);
        prVar6 = rrb_details::rrb_head_clone<int,false,6>(left->ptr);
        ref<immutable::rrb<int,_false,_6>_>::ref(&left2,prVar6);
        rrb_details::push_down_tail<int,false,6>
                  ((rrb_details *)&local_90,left,&left2,
                   (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head);
        rrb_create<int,false,6>();
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_90);
        uVar5 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
        uVar1 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar6->cnt = uVar5 + uVar1;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_90);
        prVar8 = ref<immutable::rrb<int,_false,_6>_>::operator->(&local_90);
        uVar5 = prVar8->shift;
        prVar8 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
        prVar9 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
        rrb_details::concat_sub_tree<int,false,6>
                  ((rrb_details *)&find_shift_arg,&prVar6->root,uVar5,&prVar8->root,prVar9->shift,
                   true);
        ref<immutable::rrb_details::tree_node<int,false>>::
        ref<immutable::rrb_details::internal_node<int,false>>
                  ((ref<immutable::rrb_details::tree_node<int,false>> *)&local_a8,
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)&find_shift_arg);
        uVar5 = rrb_details::find_shift<int,false,6>(&local_a8);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar6->shift = uVar5;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        rrb_details::set_sizes<int,false,6>
                  ((rrb_details *)&local_b0,
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)&find_shift_arg,
                   prVar6->shift);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        ref<immutable::rrb_details::tree_node<int,false>>::operator=
                  ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar6->root,&local_b0);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_b0);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
        prVar8 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar8->tail,&prVar6->tail);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb_1.ptr);
        uVar5 = prVar6->tail_len;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar6->tail_len = uVar5;
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_a8);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&find_shift_arg);
        ref<immutable::rrb<int,_false,_6>_>::~ref(&local_90);
        ref<immutable::rrb<int,_false,_6>_>::~ref(&left2);
        ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head);
      }
    }
  }
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_concat(const ref<rrb<T, atomic_ref_counting, N>>& left, const ref<rrb<T, atomic_ref_counting, N>>& right)
    {
    using namespace rrb_details;
    if (left->cnt == 0)
      {
      return right;
      }
    else if (right->cnt == 0)
      {
      return left;
      }
    else
      {
      if (right->root.ptr == nullptr)
        {
        // merge left and right tail, if possible
        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone<T, atomic_ref_counting, N>(left.ptr);
        new_rrb->cnt += right->cnt;

        // skip merging if left tail is full.
        if (left->tail_len == bits<N>::rrb_branching)
          {
          new_rrb->tail_len = right->tail_len;
          return push_down_tail(left, new_rrb, right->tail);
          }
        // We can merge both tails into a single tail.
        else if (left->tail_len + right->tail_len <= bits<N>::rrb_branching)
          {
          const uint32_t new_tail_len = left->tail_len + right->tail_len;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_merge<T, atomic_ref_counting>(left->tail.ptr, right->tail.ptr);
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }
        else
          { // must push down something, and will have elements remaining in
            // the right tail
          ref<leaf_node<T, atomic_ref_counting>> push_down = leaf_node_create<T, atomic_ref_counting>(bits<N>::rrb_branching);
          //memcpy(&push_down->child[0], &left->tail->child[0], left->tail_len * sizeof(T));
          for (uint32_t i = 0; i < left->tail_len; ++i)
            push_down->child[i] = left->tail->child[i]; // don't memcpy, but use copy constructor
          const uint32_t right_cut = bits<N>::rrb_branching - left->tail_len;
          //memcpy(&push_down->child[left->tail_len], &right->tail->child[0], right_cut * sizeof(T));
          for (uint32_t i = 0; i < right_cut; ++i)
            push_down->child[left->tail_len + i] = right->tail->child[i]; // don't memcpy, but use copy constructor

          // this will be strictly positive.
          const uint32_t new_tail_len = right->tail_len - right_cut;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);

          //memcpy(&new_tail->child[0], &right->tail->child[right_cut], new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = right->tail->child[right_cut + i]; // don't memcpy, but use copy constructor

          new_rrb->tail = push_down;
          new_rrb->tail_len = new_tail_len;

          // This is an imitation, so that push_down_tail works as we intend it
          // to: Whenever the height has to be increased, it calculates the size
          // table based upon the old rrb's size, minus the old tail. However,
          // since we manipulate the old tail to be longer than it actually was,
          // we have to reflect those changes in the cnt variable.

          ref<rrb<T, atomic_ref_counting, N>> left_imitation = rrb_head_clone(left.ptr);
          left_imitation->cnt = new_rrb->cnt - new_tail_len;

          return push_down_tail(left_imitation, new_rrb, new_tail);
          }
        }
      ref<leaf_node<T, atomic_ref_counting>> empty_leaf(nullptr);
      ref<rrb<T, atomic_ref_counting, N>> left_head = rrb_head_clone<T, atomic_ref_counting, N>(left.ptr);
      ref<rrb<T, atomic_ref_counting, N>> left2 = push_down_tail(left, left_head, empty_leaf);
      ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
      new_rrb->cnt = left2->cnt + right->cnt;

      ref<internal_node<T, atomic_ref_counting>> root_candidate = concat_sub_tree<T, atomic_ref_counting, N>(left2->root, left2->shift, right->root, right->shift, true);

      ref<tree_node<T, atomic_ref_counting>> find_shift_arg = root_candidate;
      new_rrb->shift = find_shift<T, atomic_ref_counting, N>(find_shift_arg);
      // must be done before we set sizes.
      new_rrb->root = set_sizes<T, atomic_ref_counting, N>(root_candidate, new_rrb->shift);
      new_rrb->tail = right->tail;
      new_rrb->tail_len = right->tail_len;
      return new_rrb;
      }
    }